

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O2

double AccumulateSSIM(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  ulong uVar11;
  double dVar12;
  double local_98;
  
  uVar11 = 3;
  iVar5 = 3;
  if (w < 3) {
    iVar5 = w;
  }
  if (h < 3) {
    uVar11 = (ulong)(uint)h;
  }
  uVar6 = 0;
  iVar1 = 0;
  if (0 < w) {
    iVar1 = w;
  }
  if ((int)uVar11 < 1) {
    uVar11 = uVar6;
  }
  lVar2 = (long)ref_stride;
  puVar8 = ref + lVar2 * -3 + -3;
  lVar3 = (long)src_stride;
  puVar9 = src + lVar3 * -3 + -3;
  local_98 = 0.0;
  for (; (int)uVar6 != (int)uVar11; uVar6 = uVar6 + 1) {
    for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
      dVar12 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,iVar4,(int)uVar6,w,h);
      local_98 = local_98 + dVar12;
    }
    puVar8 = puVar8 + lVar2;
    puVar9 = puVar9 + lVar3;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; (long)uVar6 < (long)(h + -4); uVar6 = uVar6 + 1) {
    puVar7 = puVar9;
    puVar10 = puVar8;
    for (uVar11 = 0; iVar5 != (int)uVar11; uVar11 = uVar11 + 1) {
      dVar12 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,(int)uVar11,(int)uVar6,w,h);
      local_98 = local_98 + dVar12;
      puVar10 = puVar10 + 1;
      puVar7 = puVar7 + 1;
    }
    for (; (long)uVar11 < (long)(w + -4); uVar11 = uVar11 + 1) {
      dVar12 = (*VP8SSIMGet)(puVar7,src_stride,puVar10,ref_stride);
      local_98 = local_98 + dVar12;
      puVar10 = puVar10 + 1;
      puVar7 = puVar7 + 1;
    }
    while (iVar4 = (int)uVar11, iVar4 < w) {
      dVar12 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,iVar4,(int)uVar6,w,h);
      local_98 = local_98 + dVar12;
      uVar11 = (ulong)(iVar4 + 1);
    }
    puVar8 = puVar8 + lVar2;
    puVar9 = puVar9 + lVar3;
  }
  while (iVar5 = (int)uVar6, iVar5 < h) {
    for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
      dVar12 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,iVar4,iVar5,w,h);
      local_98 = local_98 + dVar12;
    }
    uVar6 = (ulong)(iVar5 + 1);
  }
  return local_98;
}

Assistant:

static double AccumulateSSIM(const uint8_t* src, int src_stride,
                             const uint8_t* ref, int ref_stride,
                             int w, int h) {
  const int w0 = (w < VP8_SSIM_KERNEL) ? w : VP8_SSIM_KERNEL;
  const int w1 = w - VP8_SSIM_KERNEL - 1;
  const int h0 = (h < VP8_SSIM_KERNEL) ? h : VP8_SSIM_KERNEL;
  const int h1 = h - VP8_SSIM_KERNEL - 1;
  int x, y;
  double sum = 0.;
  for (y = 0; y < h0; ++y) {
    for (x = 0; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  for (; y < h1; ++y) {
    for (x = 0; x < w0; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
    for (; x < w1; ++x) {
      const int off1 = x - VP8_SSIM_KERNEL + (y - VP8_SSIM_KERNEL) * src_stride;
      const int off2 = x - VP8_SSIM_KERNEL + (y - VP8_SSIM_KERNEL) * ref_stride;
      sum += VP8SSIMGet(src + off1, src_stride, ref + off2, ref_stride);
    }
    for (; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  for (; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  return sum;
}